

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall wabt::AST::AST(AST *this,ModuleContext *mc,Func *f)

{
  _Rb_tree_header *p_Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  Index i;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->mc = mc;
  (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->f = f;
  this->value_stack_depth = 0;
  p_Var1 = &(this->vars_defined)._M_t._M_impl.super__Rb_tree_header;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vars_defined)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->flushed_vars = 0;
  (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->cur_block_id = 0;
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  if (f != (Func *)0x0) {
    ModuleContext::BeginFunc(mc,f);
    uVar2 = extraout_RDX;
    for (uVar3 = 0;
        uVar3 < (uint)((ulong)((long)(f->decl).sig.param_types.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(f->decl).sig.param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        uVar3 = uVar3 + 1) {
      IndexToAlphaName_abi_cxx11_(&local_80.first,(wabt *)(ulong)uVar3,(Index)uVar2);
      std::operator+(&local_50,"$",&local_80.first);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string((string *)&local_80,(string *)&local_50);
      local_80.second.block_id = 0;
      local_80.second.defined = false;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
                  *)&this->vars_defined,&local_80);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      uVar2 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

AST(ModuleContext& mc, const Func *f) : mc(mc), f(f) {
    if (f) {
      mc.BeginFunc(*f);
      for (Index i = 0; i < f->GetNumParams(); i++) {
        auto name = "$" + IndexToAlphaName(i);
        vars_defined.insert({ name, { 0, false }});
      }
    }
  }